

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readPartialDistribution.hpp
# Opt level: O2

PartialDistribution * __thiscall
njoy::ENDFtk::section::Type<5>::PartialDistribution::
readPartialDistribution<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (PartialDistribution *__return_storage_ptr__,PartialDistribution *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT)

{
  char *pcVar1;
  long lVar2;
  undefined8 *puVar3;
  int MAT_00;
  int iVar4;
  undefined4 in_stack_fffffffffffffcec;
  GeneralEvaporationSpectrum local_308;
  Probability probability;
  _Variant_storage<false,_njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,_njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,_njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::WattSpectrum,_njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
  local_158;
  
  MAT_00 = (int)lineNumber;
  iVar4 = MF;
  Probability::Probability<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&probability,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,begin,(long *)end,MAT_00,MAT,MF);
  switch((int)probability.super_TabulationRecord.super_InterpolationBase.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl) {
  case 1:
    TabulatedSpectrum::TabulatedSpectrum<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((TabulatedSpectrum *)&local_308,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,njoy::ENDFtk::section::Type<5>::WattSpectrum,njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
    ::
    variant<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,void,void,njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,void>
              ((variant<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,njoy::ENDFtk::section::Type<5>::WattSpectrum,njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
                *)&local_158,(TabulatedSpectrum *)&local_308);
    PartialDistribution(__return_storage_ptr__,&probability,(Distribution *)&local_158);
    std::__detail::__variant::
    _Variant_storage<false,_njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,_njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,_njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::WattSpectrum,_njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
    ::~_Variant_storage(&local_158);
    InterpolationSequenceRecord<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum::OutgoingEnergyDistribution>
    ::~InterpolationSequenceRecord
              ((InterpolationSequenceRecord<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum::OutgoingEnergyDistribution>
                *)&local_308);
    goto LAB_001452eb;
  default:
    tools::Log::error<char_const*>((char *)CONCAT44(in_stack_fffffffffffffcec,iVar4));
    tools::Log::info<char_const*>((char *)CONCAT44(in_stack_fffffffffffffcec,iVar4));
    tools::Log::info<char_const*,int>
              ("LF value: {}",
               (int)probability.super_TabulationRecord.super_InterpolationBase.metadata.fields.
                    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                    super__Tuple_impl<2UL,_long,_long,_long,_long>.
                    super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                    _M_head_impl);
    pcVar1 = end->_M_current;
    lVar2 = TabulationRecord::NC(&probability.super_TabulationRecord);
    tools::Log::info<char_const*,long>("Line number: {}",(long)pcVar1 - lVar2);
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = getenv;
    __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
  case 5:
    GeneralEvaporationSpectrum::
    GeneralEvaporationSpectrum<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (&local_308,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,njoy::ENDFtk::section::Type<5>::WattSpectrum,njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
    ::
    variant<njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,void,void,njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,void>
              ((variant<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,njoy::ENDFtk::section::Type<5>::WattSpectrum,njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
                *)&local_158,&local_308);
    PartialDistribution(__return_storage_ptr__,&probability,(Distribution *)&local_158);
    std::__detail::__variant::
    _Variant_storage<false,_njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,_njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,_njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::WattSpectrum,_njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
    ::~_Variant_storage(&local_158);
    GeneralEvaporationSpectrum::~GeneralEvaporationSpectrum(&local_308);
    goto LAB_001452eb;
  case 7:
    MaxwellianFissionSpectrum::
    MaxwellianFissionSpectrum<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((MaxwellianFissionSpectrum *)&local_308,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,njoy::ENDFtk::section::Type<5>::WattSpectrum,njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
    ::
    variant<njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,void,void,njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,void>
              ((variant<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,njoy::ENDFtk::section::Type<5>::WattSpectrum,njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
                *)&local_158,(MaxwellianFissionSpectrum *)&local_308);
    PartialDistribution(__return_storage_ptr__,&probability,(Distribution *)&local_158);
    break;
  case 9:
    EvaporationSpectrum::
    EvaporationSpectrum<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((EvaporationSpectrum *)&local_308,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,njoy::ENDFtk::section::Type<5>::WattSpectrum,njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
    ::
    variant<njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,void,void,njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,void>
              ((variant<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,njoy::ENDFtk::section::Type<5>::WattSpectrum,njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
                *)&local_158,(EvaporationSpectrum *)&local_308);
    PartialDistribution(__return_storage_ptr__,&probability,(Distribution *)&local_158);
    break;
  case 0xb:
    WattSpectrum::WattSpectrum<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((WattSpectrum *)&local_308,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,njoy::ENDFtk::section::Type<5>::WattSpectrum,njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
    ::
    variant<njoy::ENDFtk::section::Type<5>::WattSpectrum,void,void,njoy::ENDFtk::section::Type<5>::WattSpectrum,void>
              ((variant<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,njoy::ENDFtk::section::Type<5>::WattSpectrum,njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
                *)&local_158,(WattSpectrum *)&local_308);
    PartialDistribution(__return_storage_ptr__,&probability,(Distribution *)&local_158);
    std::__detail::__variant::
    _Variant_storage<false,_njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,_njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,_njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::WattSpectrum,_njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
    ::~_Variant_storage(&local_158);
    std::array<njoy::ENDFtk::section::Type<5>::Parameter,_2UL>::~array
              ((array<njoy::ENDFtk::section::Type<5>::Parameter,_2UL> *)&local_308);
    goto LAB_001452eb;
  case 0xc:
    MadlandNixSpectrum::MadlandNixSpectrum<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((MadlandNixSpectrum *)&local_308,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,njoy::ENDFtk::section::Type<5>::WattSpectrum,njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
    ::
    variant<njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum,void,void,njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum,void>
              ((variant<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,njoy::ENDFtk::section::Type<5>::WattSpectrum,njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
                *)&local_158,(MadlandNixSpectrum *)&local_308);
    PartialDistribution(__return_storage_ptr__,&probability,(Distribution *)&local_158);
  }
  std::__detail::__variant::
  _Variant_storage<false,_njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,_njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,_njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::WattSpectrum,_njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
  ::~_Variant_storage(&local_158);
  TabulationRecord::~TabulationRecord((TabulationRecord *)&local_308);
LAB_001452eb:
  TabulationRecord::~TabulationRecord(&probability.super_TabulationRecord);
  return __return_storage_ptr__;
}

Assistant:

static PartialDistribution
readPartialDistribution( Iterator& begin,
                         const Iterator& end,
                         long& lineNumber,
                         int MAT,
                         int MF,
                         int MT ) {

  Probability probability( begin, end, lineNumber, MAT, MF, MT );
  switch ( probability.LF() ) {
    case 1 :
      return PartialDistribution
             ( std::move( probability ),
               TabulatedSpectrum( begin, end, lineNumber, MAT, MF, MT ) );
    case 5 :
      return PartialDistribution
             ( std::move( probability ),
               GeneralEvaporationSpectrum( begin, end, lineNumber, MAT, MF, MT ) );
    case 7 :
      return PartialDistribution
             ( std::move( probability ),
               MaxwellianFissionSpectrum( begin, end, lineNumber, MAT, MF, MT ) );
    case 9 :
      return PartialDistribution
             ( std::move( probability ),
               EvaporationSpectrum( begin, end, lineNumber, MAT, MF, MT ) );
    case 11 :
      return PartialDistribution
             ( std::move( probability ),
               WattSpectrum( begin, end, lineNumber, MAT, MF, MT ) );
    case 12 :
      return PartialDistribution
             ( std::move( probability ),
               MadlandNixSpectrum( begin, end, lineNumber, MAT, MF, MT ) );
    default : {
      Log::error( "Encountered illegal LF value" );
      Log::info( "LF must be equal to 1, 5, 7, 9, 11 or 12" );
      Log::info( "LF value: {}", probability.LF() );
      Log::info( "Line number: {}", lineNumber - probability.NC() );
      throw std::exception();
    }
  }
}